

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrEvalFullXPtr(xmlXPathParserContextPtr ctxt,xmlChar *name)

{
  xmlXPathObjectType xVar1;
  int iVar2;
  int *piVar3;
  xmlNodeSetPtr pxVar4;
  xmlXPathObjectPtr obj_00;
  bool bVar5;
  xmlNodeSetPtr loc_1;
  xmlLocationSetPtr loc;
  xmlXPathObjectPtr obj;
  xmlChar *name_local;
  xmlXPathParserContextPtr ctxt_local;
  
  obj = (xmlXPathObjectPtr)name;
  if (name == (xmlChar *)0x0) {
    obj = (xmlXPathObjectPtr)xmlXPathParseName(ctxt);
  }
  if (obj == (xmlXPathObjectPtr)0x0) {
    xmlXPathErr(ctxt,7);
  }
  else {
    while (obj != (xmlXPathObjectPtr)0x0) {
      ctxt->error = 0;
      xmlXPtrEvalXPtrPart(ctxt,(xmlChar *)obj);
      if ((ctxt->error != 0) && (ctxt->error != 0x76c)) {
        return;
      }
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        xVar1 = ctxt->value->type;
        if (xVar1 == XPATH_NODESET) {
          pxVar4 = ctxt->value->nodesetval;
          if (pxVar4 != (xmlNodeSetPtr)0x0) {
            iVar2 = pxVar4->nodeNr;
            goto joined_r0x00274209;
          }
        }
        else if ((xVar1 == XPATH_LOCATIONSET) &&
                (piVar3 = (int *)ctxt->value->user, piVar3 != (int *)0x0)) {
          iVar2 = *piVar3;
joined_r0x00274209:
          if (0 < iVar2) {
            return;
          }
        }
        while (obj_00 = valuePop(ctxt), obj_00 != (xmlXPathObjectPtr)0x0) {
          xmlXPathFreeObject(obj_00);
        }
      }
      while( true ) {
        bVar5 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar5 = true, 10 < *ctxt->cur)))) {
          bVar5 = *ctxt->cur == '\r';
        }
        if (!bVar5) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      obj = (xmlXPathObjectPtr)xmlXPathParseName(ctxt);
    }
  }
  return;
}

Assistant:

static void
xmlXPtrEvalFullXPtr(xmlXPathParserContextPtr ctxt, xmlChar *name) {
    if (name == NULL)
    name = xmlXPathParseName(ctxt);
    if (name == NULL)
	XP_ERROR(XPATH_EXPR_ERROR);
    while (name != NULL) {
	ctxt->error = XPATH_EXPRESSION_OK;
	xmlXPtrEvalXPtrPart(ctxt, name);

	/* in case of syntax error, break here */
	if ((ctxt->error != XPATH_EXPRESSION_OK) &&
            (ctxt->error != XML_XPTR_UNKNOWN_SCHEME))
	    return;

	/*
	 * If the returned value is a non-empty nodeset
	 * or location set, return here.
	 */
	if (ctxt->value != NULL) {
	    xmlXPathObjectPtr obj = ctxt->value;

	    switch (obj->type) {
		case XPATH_LOCATIONSET: {
		    xmlLocationSetPtr loc = ctxt->value->user;
		    if ((loc != NULL) && (loc->locNr > 0))
			return;
		    break;
		}
		case XPATH_NODESET: {
		    xmlNodeSetPtr loc = ctxt->value->nodesetval;
		    if ((loc != NULL) && (loc->nodeNr > 0))
			return;
		    break;
		}
		default:
		    break;
	    }

	    /*
	     * Evaluating to improper values is equivalent to
	     * a sub-resource error, clean-up the stack
	     */
	    do {
		obj = valuePop(ctxt);
		if (obj != NULL) {
		    xmlXPathFreeObject(obj);
		}
	    } while (obj != NULL);
	}

	/*
	 * Is there another XPointer part.
	 */
	SKIP_BLANKS;
	name = xmlXPathParseName(ctxt);
    }
}